

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

void mqtt_client_deinit(MQTT_CLIENT_HANDLE handle)

{
  if (handle != (MQTT_CLIENT_HANDLE)0x0) {
    tickcounter_destroy(handle->packetTickCntr);
    mqtt_codec_destroy(handle->codec_handle);
    clear_mqtt_options(handle);
    free(handle);
    return;
  }
  return;
}

Assistant:

void mqtt_client_deinit(MQTT_CLIENT_HANDLE handle)
{
    /*Codes_SRS_MQTT_CLIENT_07_004: [If the parameter handle is NULL then function mqtt_client_deinit shall do nothing.]*/
    if (handle != NULL)
    {
        /*Codes_SRS_MQTT_CLIENT_07_005: [mqtt_client_deinit shall deallocate all memory allocated in this unit.]*/
        MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
        tickcounter_destroy(mqtt_client->packetTickCntr);
        mqtt_codec_destroy(mqtt_client->codec_handle);
        clear_mqtt_options(mqtt_client);
        free(mqtt_client);
    }
}